

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

uint gvr::anon_unknown_1::findOrStoreVertex
               (Mesh *mesh,
               set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
               *vni,int *vn,Vector3f *v,Vector3f *normal)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int iVar3;
  _Base_ptr p_Var4;
  float *pfVar5;
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  *psVar6;
  bool bVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr *pp_Var10;
  long lVar11;
  VertexNormalIndex *extraout_RDX;
  VertexNormalIndex *extraout_RDX_00;
  VertexNormalIndex *extraout_RDX_01;
  VertexNormalIndex *extraout_RDX_02;
  _Alloc_node __an;
  _Rb_tree_node_base *p_Var12;
  undefined1 auVar13 [16];
  undefined1 local_68 [32];
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  *local_48;
  Mesh *local_40;
  int *local_38;
  
  local_40 = mesh;
  local_38 = vn;
  local_68._8_4_ = (undefined4)((ulong)*(undefined8 *)(v->v + 1) >> 0x20);
  local_68._0_4_ = v->v[0];
  local_68._4_4_ = v->v[1];
  local_68._12_4_ = normal->v[0];
  local_68._16_4_ = (undefined4)*(undefined8 *)(normal->v + 1);
  local_68._20_4_ = (undefined4)((ulong)*(undefined8 *)(normal->v + 1) >> 0x20);
  local_68._24_4_ = *vn;
  p_Var9 = (vni->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_48 = vni;
  p_Var1 = &(vni->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = p_Var9;
  p_Var12 = &p_Var1->_M_header;
  for (; p_Var4 != (_Rb_tree_node_base *)0x0; p_Var4 = (&p_Var4->_M_left)[bVar7]) {
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(p_Var4 + 1),
                       (VertexNormalIndex *)local_68,(VertexNormalIndex *)vn);
    if (!bVar7) {
      p_Var12 = p_Var4;
    }
    vn = (int *)extraout_RDX;
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
     (bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)local_68,
                         (VertexNormalIndex *)(p_Var12 + 1),(VertexNormalIndex *)vn),
     p_Var8 = p_Var12, vn = (int *)extraout_RDX_00, bVar7)) {
    p_Var8 = &p_Var1->_M_header;
  }
  psVar6 = local_48;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    pp_Var10 = &p_Var8[1]._M_right;
    goto LAB_00124204;
  }
  if (p_Var9 == (_Rb_tree_node_base *)0x0) {
    bVar7 = true;
    p_Var9 = (_Base_ptr)0x0;
    p_Var12 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var12 = p_Var9;
      bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)local_68,
                         (VertexNormalIndex *)(p_Var12 + 1),(VertexNormalIndex *)vn);
      p_Var9 = (&p_Var12->_M_left)[!bVar7];
      vn = (int *)extraout_RDX_01;
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  auVar13._8_8_ = vn;
  auVar13._0_8_ = p_Var12;
  if (bVar7 == false) {
LAB_00124157:
    bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(auVar13._0_8_ + 1),
                       (VertexNormalIndex *)local_68,auVar13._8_8_);
    vn = (int *)extraout_RDX_02;
    if (!bVar7) {
      p_Var12 = (_Rb_tree_node_base *)0x0;
      p_Var9 = auVar13._0_8_;
    }
  }
  else if (p_Var12 != (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
    auVar13 = std::_Rb_tree_decrement(p_Var12);
    goto LAB_00124157;
  }
  if (p_Var12 != (_Rb_tree_node_base *)0x0) {
    bVar7 = true;
    if ((p_Var9 == (_Base_ptr)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var12)) {
      bVar7 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)local_68,
                         (VertexNormalIndex *)(p_Var12 + 1),(VertexNormalIndex *)vn);
    }
    p_Var9 = (_Rb_tree_node_base *)operator_new(0x40);
    *(ulong *)(p_Var9 + 1) = CONCAT44(local_68._4_4_,local_68._0_4_);
    p_Var9[1]._M_parent = (_Base_ptr)CONCAT44(local_68._12_4_,local_68._8_4_);
    *(ulong *)((long)&p_Var9[1]._M_parent + 4) = CONCAT44(local_68._16_4_,local_68._12_4_);
    *(ulong *)((long)&p_Var9[1]._M_left + 4) = CONCAT44(local_68._24_4_,local_68._20_4_);
    std::_Rb_tree_insert_and_rebalance(bVar7,p_Var9,p_Var12,&p_Var1->_M_header);
    psVar2 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  pp_Var10 = (_Base_ptr *)(local_68 + 0x18);
  iVar3 = *local_38;
  lVar11 = (long)iVar3;
  pfVar5 = (local_40->super_PointCloud).vertex;
  pfVar5[lVar11 * 3] = v->v[0];
  pfVar5[lVar11 * 3 + 1] = v->v[1];
  pfVar5[lVar11 * 3 + 2] = v->v[2];
  *local_38 = iVar3 + 1;
LAB_00124204:
  return *(uint *)pp_Var10;
}

Assistant:

unsigned int findOrStoreVertex(Mesh *mesh, std::set<VertexNormalIndex> &vni,
  int &vn, const gmath::Vector3f &v, const gmath::Vector3f &normal)
{
  // try to find point v in the vertex list of mesh, but it is only considered
  // a duplicate if the normals are the same


  VertexNormalIndex p(v, normal, vn);
  std::set<VertexNormalIndex>::iterator it=vni.find(p);

  // add the vertex, if a duplicate cannot be found

  if (it != vni.end())
  {
    return it->index;
  }
  else
  {
    vni.insert(p);
    mesh->setVertex(vn, v);
    vn++;

    return p.index;
  }
}